

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O1

char * MyGame_Example_neg_enum_parse_json_enum
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int *value_sign,uint64_t *value,
                 int *aggregate)

{
  ulong uVar1;
  char *pcVar2;
  uint64_t uVar3;
  
  if ((ulong)((long)end - (long)buf) < 8) {
    uVar1 = 0;
    switch((long)end - (long)buf) {
    case 7:
      uVar1 = (long)buf[6] << 8;
    case 6:
      uVar1 = uVar1 | (long)buf[5] << 0x10;
    case 5:
      uVar1 = uVar1 | (long)buf[4] << 0x18;
    case 4:
      uVar1 = uVar1 | (long)buf[3] << 0x20;
    case 3:
      uVar1 = uVar1 | (long)buf[2] << 0x28;
    case 2:
      uVar1 = uVar1 | (long)buf[1] << 0x30;
    case 1:
      uVar1 = uVar1 | (ulong)(byte)*buf << 0x38;
    }
  }
  else {
    uVar1 = *(ulong *)buf;
    uVar1 = (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 |
            uVar1 << 0x38;
  }
  if ((uint)(uVar1 >> 0x21) < 0x3732b399) {
    if ((uVar1 & 0x7fffffff00000000) != 0x6e65673100000000) {
      return buf;
    }
    pcVar2 = flatcc_json_parser_match_constant(ctx,buf,end,4,aggregate);
    if (pcVar2 == buf) {
      return buf;
    }
    uVar3 = 0xfffffffffffffff4;
  }
  else if ((uVar1 & 0xffffffff00000000) == 0x6e65673200000000) {
    pcVar2 = flatcc_json_parser_match_constant(ctx,buf,end,4,aggregate);
    if (pcVar2 == buf) {
      return buf;
    }
    uVar3 = 0xfffffffffffffff5;
  }
  else {
    if ((uVar1 & 0xffffffff00000000) != 0x6e65673300000000) {
      return buf;
    }
    pcVar2 = flatcc_json_parser_match_constant(ctx,buf,end,4,aggregate);
    if (pcVar2 == buf) {
      return buf;
    }
    uVar3 = 0xfffffffffffffff6;
  }
  *value = uVar3;
  *value_sign = 1;
  return pcVar2;
}

Assistant:

static const char *MyGame_Example_neg_enum_parse_json_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,
        int *value_sign, uint64_t *value, int *aggregate)
{
    const char *unmatched = buf;
    const char *mark;
    uint64_t w;

    w = flatcc_json_parser_symbol_part(buf, end);
    if (w < 0x6e65673200000000) { /* branch "neg2" */
        if ((w & 0xffffffff00000000) == 0x6e65673100000000) { /* "neg1" */
            buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 4, aggregate);
            if (buf != mark) {
                *value = UINT64_C(18446744073709551604), *value_sign = 1;
            } else {
                return unmatched;
            }
        } else { /* "neg1" */
            return unmatched;
        } /* "neg1" */
    } else { /* branch "neg2" */
        if ((w & 0xffffffff00000000) == 0x6e65673300000000) { /* "neg3" */
            buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 4, aggregate);
            if (buf != mark) {
                *value = UINT64_C(18446744073709551606), *value_sign = 1;
            } else {
                return unmatched;
            }
        } else { /* "neg3" */
            if ((w & 0xffffffff00000000) == 0x6e65673200000000) { /* "neg2" */
                buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 4, aggregate);
                if (buf != mark) {
                    *value = UINT64_C(18446744073709551605), *value_sign = 1;
                } else {
                    return unmatched;
                }
            } else { /* "neg2" */
                return unmatched;
            } /* "neg2" */
        } /* "neg3" */
    } /* branch "neg2" */
    return buf;
}